

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManResubTest3(void)

{
  void **ppDivs;
  uint uVar1;
  int *__ptr;
  void *pvVar2;
  Vec_Int_t *p;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  word Truth;
  int *pArray;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  puVar6 = &local_68;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xcccccccccccccccc;
  local_48 = 0xf0f0f0f0f0f0f0f0;
  local_40 = 0xff00ff00ff00ff00;
  __ptr = (int *)malloc(0x10);
  __ptr[0] = 8;
  __ptr[1] = 0;
  pvVar2 = malloc(0x40);
  *(void **)(__ptr + 2) = pvVar2;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  iVar4 = 8;
  lVar8 = 0;
  do {
    pvVar2 = *(void **)(__ptr + 2);
    if ((int)lVar8 == iVar4) {
      if (pvVar2 == (void *)0x0) {
        pvVar2 = malloc(0x80);
      }
      else {
        pvVar2 = realloc(pvVar2,0x80);
      }
      *(void **)(__ptr + 2) = pvVar2;
      iVar4 = 0x10;
    }
    *(ulong **)((long)pvVar2 + lVar8 * 8) = puVar6;
    lVar8 = lVar8 + 1;
    puVar6 = puVar6 + 1;
  } while (lVar8 != 6);
  __ptr[1] = 6;
  *__ptr = iVar4;
  Abc_ResubPrepareManager(1);
  uVar7 = 0;
  do {
    Truth = uVar7 * 0x1000100010001;
    local_68 = ~Truth;
    uStack_60 = Truth;
    printf("%3d : ",uVar7 & 0xffffffff);
    Extra_PrintHex(_stdout,(uint *)&Truth,4);
    putchar(0x20);
    Dau_DsdPrintFromTruth2(&Truth,4);
    printf("           ");
    ppDivs = *(void ***)(__ptr + 2);
    uVar1 = Abc_ResubComputeFunction(ppDivs,6,1,0x10,0x32,0,0,1,1,&pArray);
    putchar(10);
    piVar3 = pArray;
    p->nSize = 0;
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        Vec_IntPush(p,piVar3[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    bVar9 = uVar7 != 1000;
    uVar7 = uVar7 + 1;
  } while (bVar9);
  if (s_pResbMan != (Gia_ResbMan_t *)0x0) {
    Gia_ResbFree(s_pResbMan);
  }
  s_pResbMan = (Gia_ResbMan_t *)0x0;
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (ppDivs != (void **)0x0) {
    free(ppDivs);
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManResubTest3()
{
    int nVars = 4;
    int fVerbose = 1;
    word Divs[6] = { 0, 0, 
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00) 
    };
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( 6 );
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i, k, ArraySize, * pArray; 
    for ( i = 0; i < 6; i++ )
        Vec_PtrPush( vDivs, Divs+i );
    Abc_ResubPrepareManager( 1 );
    for ( i = 0; i < (1<<(1<<nVars)); i++ ) //if ( i == 0xCA ) 
    {
        word Truth = Abc_Tt6Stretch( i, nVars );
        Divs[0] = ~Truth;
        Divs[1] =  Truth;
        printf( "%3d : ", i );
        Extra_PrintHex( stdout, (unsigned*)&Truth, nVars );
        printf( " " );
        Dau_DsdPrintFromTruth2( &Truth, nVars );
        printf( "           " );

        //Abc_ResubDumpProblem( "temp.resub", (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1 );
        ArraySize = Abc_ResubComputeFunction( (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1, 16, 50, 0, 0, 1, fVerbose, &pArray );
        printf( "\n" );

        Vec_IntClear( vRes );
        for ( k = 0; k < ArraySize; k++ )
            Vec_IntPush( vRes, pArray[k] );

        if ( i == 1000 )
            break;
    }
    Abc_ResubPrepareManager( 0 );
    Vec_IntFree( vRes );
    Vec_PtrFree( vDivs );
}